

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O1

void __thiscall GEO::LineInput::conversion_error(LineInput *this,index_t index,char *type)

{
  ostream *poVar1;
  size_t sVar2;
  char *pcVar3;
  logic_error *this_00;
  ostringstream out;
  string local_1c0 [32];
  ostringstream local_1a0 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Line ",5);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,": field #",9);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," is not a valid ",0x10);
  if (type == (char *)0x0) {
    std::ios::clear((int)poVar1 + (int)poVar1->_vptr_basic_ostream[-3]);
  }
  else {
    sVar2 = strlen(type);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,type,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," value: ",8);
  pcVar3 = field(this,index);
  std::operator<<(poVar1,pcVar3);
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::logic_error::logic_error(this_00,local_1c0);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void LineInput::conversion_error(index_t index, const char* type) const {
        std::ostringstream out;
        out << "Line " << line_num_
            << ": field #" << index
            << " is not a valid " << type << " value: " << field(index);
        throw std::logic_error(out.str());
    }